

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zstd_compress.cpp
# Opt level: O1

size_t duckdb_zstd::ZSTD_compressSequences
                 (ZSTD_CCtx *cctx,void *dst,size_t dstCapacity,ZSTD_Sequence *inSeqs,
                 size_t inSeqsSize,void *src,size_t srcSize)

{
  BYTE BVar1;
  ZSTD_sequenceFormat_e ZVar2;
  ZSTD_compressedBlockState_t *pZVar3;
  ZSTD_compressedBlockState_t *pZVar4;
  short sVar5;
  int iVar6;
  size_t err_code_2;
  size_t sVar7;
  ulong uVar8;
  ulong uVar9;
  unsigned_long_long uVar10;
  ulong uVar11;
  int iVar12;
  long lVar13;
  ulong uVar14;
  ulong uVar15;
  size_t sVar16;
  uint *puVar17;
  size_t err_code_1;
  ulong uVar18;
  undefined8 uVar19;
  ulong local_d0;
  BYTE *op;
  BYTE *local_b8;
  ulong local_a8;
  code *local_98;
  ulong local_48 [3];
  
  sVar7 = ZSTD_CCtx_init_compressStream2(cctx,ZSTD_e_end,srcSize);
  if (0xffffffffffffff88 < sVar7) {
    return sVar7;
  }
  uVar19 = 0x1276e70;
  sVar7 = ZSTD_writeFrameHeader(dst,dstCapacity,&cctx->appliedParams,srcSize,cctx->dictID);
  if ((srcSize != 0) && ((cctx->appliedParams).fParams.checksumFlag != 0)) {
    uVar19 = 0x1276e9b;
    XXH64_update(&cctx->xxhState,src,srcSize);
  }
  local_48[0] = 0;
  local_48[1] = 0;
  ZVar2 = (cctx->appliedParams).blockDelimiters;
  uVar8 = 0;
  local_98 = (code *)0x0;
  if (ZVar2 == ZSTD_sf_noBlockDelimiters) {
    local_98 = ZSTD_copySequencesToSeqStoreNoBlockDelim;
  }
  if (ZVar2 == ZSTD_sf_explicitBlockDelimiters) {
    local_98 = ZSTD_copySequencesToSeqStoreExplicitBlockDelim;
  }
  op = (BYTE *)((long)dst + sVar7);
  uVar18 = dstCapacity - sVar7;
  local_d0 = uVar18;
  if (srcSize == 0) {
    if (uVar18 < 4) {
      uVar8 = 0;
    }
    else {
      op[0] = '\x01';
      op[1] = '\0';
      op[2] = '\0';
      op[3] = '\0';
      op = op + 3;
      uVar8 = 3;
      local_d0 = uVar18 - 3;
    }
    local_a8 = 0xffffffffffffffba;
    if (uVar18 < 4) goto LAB_01277389;
  }
  local_a8 = uVar8;
  if (srcSize != 0) {
    uVar8 = 0xffffffffffffffba;
    local_b8 = (BYTE *)src;
    do {
      uVar9 = cctx->blockSize;
      if ((cctx->appliedParams).blockDelimiters == ZSTD_sf_noBlockDelimiters) {
        uVar15 = uVar9;
        if (srcSize < uVar9) {
          uVar15 = srcSize;
        }
      }
      else {
        uVar15 = local_48[0] & 0xffffffff;
        uVar11 = 0xffffffffffffff95;
        lVar13 = inSeqsSize - uVar15;
        if (uVar15 <= inSeqsSize && lVar13 != 0) {
          puVar17 = &inSeqs[uVar15].matchLength;
          uVar15 = 0;
          do {
            uVar15 = (puVar17[-1] + *puVar17) + uVar15;
            if (((ZSTD_Sequence *)(puVar17 + -2))->offset == 0) {
              uVar11 = uVar15;
              if (*puVar17 != 0) {
                uVar11 = 0xffffffffffffff95;
              }
              break;
            }
            puVar17 = puVar17 + 4;
            lVar13 = lVar13 + -1;
          } while (lVar13 != 0);
        }
        uVar15 = uVar11;
        if (((uVar11 < 0xffffffffffffff89) && (uVar15 = 0xffffffffffffff95, uVar11 <= uVar9)) &&
           (uVar15 = uVar11, srcSize < uVar11)) {
          uVar15 = 0xffffffffffffff95;
        }
      }
      iVar12 = 1;
      uVar9 = uVar15;
      if (uVar15 < 0xffffffffffffff89) {
        (cctx->seqStore).lit = (cctx->seqStore).litStart;
        (cctx->seqStore).sequences = (cctx->seqStore).sequencesStart;
        (cctx->seqStore).longLengthType = ZSTD_llt_none;
        uVar9 = (*local_98)(cctx,local_48,inSeqs,inSeqsSize,local_b8,uVar15,
                            (cctx->appliedParams).searchForExternalRepcodes);
        if (uVar9 < 0xffffffffffffff89) {
          uVar11 = uVar15 - uVar9;
          sVar5 = (short)uVar11;
          if (uVar11 < 7) {
            uVar9 = 0xffffffffffffffba;
            if (uVar11 + 3 <= local_d0) {
              *(ushort *)op = (ushort)(uVar15 == srcSize) + sVar5 * 8;
              op[2] = '\0';
              uVar19 = 0x12770eb;
              switchD_00b1522a::default(op + 3,local_b8,uVar11);
              uVar9 = uVar11 + 3;
            }
            iVar12 = 1;
            if (uVar9 < 0xffffffffffffff89) {
              local_a8 = local_a8 + uVar9;
              local_b8 = local_b8 + uVar11;
              op = op + uVar9;
              srcSize = srcSize - uVar11;
              local_d0 = local_d0 - uVar9;
              uVar9 = uVar8;
              iVar12 = 0xe;
            }
          }
          else if (local_d0 < 3) {
            uVar9 = 0xffffffffffffffba;
          }
          else {
            uVar9 = ZSTD_entropyCompressSeqStore
                              (&cctx->seqStore,&((cctx->blockState).prevCBlock)->entropy,
                               &((cctx->blockState).nextCBlock)->entropy,&cctx->appliedParams,op + 3
                               ,local_d0 - 3,uVar11,cctx->entropyWorkspace,(ulong)(uint)cctx->bmi2,
                               (int)uVar19);
            if (uVar9 < 0xffffffffffffff89) {
              if (((cctx->isFirstBlock == 0) &&
                  ((ulong)((long)(cctx->seqStore).sequences - (long)(cctx->seqStore).sequencesStart)
                   < 0x20)) &&
                 ((ulong)((long)(cctx->seqStore).lit - (long)(cctx->seqStore).litStart) < 10)) {
                uVar19 = 0x12771e9;
                iVar6 = ZSTD_isRLE(local_b8,uVar11);
                if (iVar6 != 0) {
                  uVar9 = 1;
                }
              }
              if (uVar9 == 1) {
                uVar9 = 0xffffffffffffffba;
                if (local_d0 == 3) goto LAB_01277281;
                BVar1 = *local_b8;
                *(ushort *)op = (uVar15 == srcSize) + 2 + sVar5 * 8;
                op[2] = (BYTE)(uVar11 >> 0xd);
                op[3] = BVar1;
                uVar14 = 4;
              }
              else if (uVar9 == 0) {
                uVar9 = 0xffffffffffffffba;
                if (uVar11 + 3 <= local_d0) {
                  *(ushort *)op = (ushort)(uVar15 == srcSize) + sVar5 * 8;
                  op[2] = (BYTE)(uVar11 >> 0xd);
                  uVar19 = 0x1277256;
                  switchD_00b1522a::default(op + 3,local_b8,uVar11);
                  uVar9 = uVar11 + 3;
                }
                uVar14 = uVar9;
                if (0xffffffffffffff88 < uVar9) goto LAB_01277281;
              }
              else {
                pZVar3 = (cctx->blockState).prevCBlock;
                pZVar4 = (cctx->blockState).nextCBlock;
                (cctx->blockState).prevCBlock = pZVar4;
                (cctx->blockState).nextCBlock = pZVar3;
                if ((pZVar4->entropy).fse.offcode_repeatMode == FSE_repeat_valid) {
                  (pZVar4->entropy).fse.offcode_repeatMode = FSE_repeat_check;
                }
                *(ushort *)op = (uVar15 == srcSize) + 4 + (short)uVar9 * 8;
                op[2] = (BYTE)(uVar9 >> 0xd);
                uVar14 = uVar9 + 3;
              }
              local_a8 = local_a8 + uVar14;
              uVar9 = uVar8;
              iVar12 = 0xf;
              if (uVar15 != srcSize) {
                local_b8 = local_b8 + uVar11;
                op = op + uVar14;
                srcSize = srcSize - uVar11;
                local_d0 = local_d0 - uVar14;
                cctx->isFirstBlock = 0;
                iVar12 = 0;
              }
            }
          }
        }
      }
LAB_01277281:
      if ((iVar12 != 0) && (iVar12 != 0xe)) {
        if (iVar12 != 0xf) {
          local_a8 = uVar9;
        }
        break;
      }
      uVar8 = uVar9;
    } while (srcSize != 0);
  }
LAB_01277389:
  sVar16 = local_a8;
  if ((local_a8 < 0xffffffffffffff89) &&
     (sVar7 = sVar7 + local_a8, sVar16 = sVar7, (cctx->appliedParams).fParams.checksumFlag != 0)) {
    uVar10 = XXH64_digest(&cctx->xxhState);
    sVar16 = 0xffffffffffffffba;
    if (3 < uVar18 - local_a8) {
      *(int *)((long)dst + sVar7) = (int)uVar10;
      sVar16 = sVar7 + 4;
    }
  }
  return sVar16;
}

Assistant:

size_t ZSTD_compressSequences(ZSTD_CCtx* cctx,
                              void* dst, size_t dstCapacity,
                              const ZSTD_Sequence* inSeqs, size_t inSeqsSize,
                              const void* src, size_t srcSize)
{
    BYTE* op = (BYTE*)dst;
    size_t cSize = 0;
    size_t compressedBlocksSize = 0;
    size_t frameHeaderSize = 0;

    /* Transparent initialization stage, same as compressStream2() */
    DEBUGLOG(4, "ZSTD_compressSequences (dstCapacity=%zu)", dstCapacity);
    assert(cctx != NULL);
    FORWARD_IF_ERROR(ZSTD_CCtx_init_compressStream2(cctx, ZSTD_e_end, srcSize), "CCtx initialization failed");
    /* Begin writing output, starting with frame header */
    frameHeaderSize = ZSTD_writeFrameHeader(op, dstCapacity, &cctx->appliedParams, srcSize, cctx->dictID);
    op += frameHeaderSize;
    dstCapacity -= frameHeaderSize;
    cSize += frameHeaderSize;
    if (cctx->appliedParams.fParams.checksumFlag && srcSize) {
        XXH64_update(&cctx->xxhState, src, srcSize);
    }
    /* cSize includes block header size and compressed sequences size */
    compressedBlocksSize = ZSTD_compressSequences_internal(cctx,
                                                           op, dstCapacity,
                                                           inSeqs, inSeqsSize,
                                                           src, srcSize);
    FORWARD_IF_ERROR(compressedBlocksSize, "Compressing blocks failed!");
    cSize += compressedBlocksSize;
    dstCapacity -= compressedBlocksSize;

    if (cctx->appliedParams.fParams.checksumFlag) {
        U32 const checksum = (U32) XXH64_digest(&cctx->xxhState);
        RETURN_ERROR_IF(dstCapacity<4, dstSize_tooSmall, "no room for checksum");
        DEBUGLOG(4, "Write checksum : %08X", (unsigned)checksum);
        MEM_writeLE32((char*)dst + cSize, checksum);
        cSize += 4;
    }

    DEBUGLOG(4, "Final compressed size: %zu", cSize);
    return cSize;
}